

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int os_date(lua_State *L)

{
  char cVar1;
  int iVar2;
  char *__s1;
  tm *stm;
  size_t sVar3;
  char *__s2;
  char *pcVar4;
  char cc [4];
  time_t t;
  tm *local_470;
  char *local_468;
  char *local_460;
  size_t slen;
  luaL_Buffer b;
  
  __s1 = luaL_optlstring(L,1,"%c",&slen);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    t = time((time_t *)0x0);
  }
  else {
    t = luaL_checkinteger(L,2);
  }
  pcVar4 = __s1 + slen;
  if (*__s1 == '!') {
    stm = (tm *)gmtime(&t);
    __s1 = __s1 + 1;
  }
  else {
    stm = (tm *)localtime(&t);
  }
  if (stm == (tm *)0x0) {
    iVar2 = luaL_error(L,"date result cannot be represented in this installation");
  }
  else {
    if (((*__s1 == '*') && (__s1[1] == 't')) && (__s1[2] == '\0')) {
      lua_createtable(L,0,9);
      setallfields(L,stm);
    }
    else {
      cc[0] = '%';
      luaL_buffinit(L,&b);
      local_470 = stm;
      local_468 = pcVar4;
      while (__s1 < pcVar4) {
        cVar1 = *__s1;
        if (cVar1 == '%') {
          local_460 = luaL_prepbuffsize(&b,0xfa);
          __s1 = __s1 + 1;
          __s2 = "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
          sVar3 = 1;
          while ((*__s2 != '\0' && ((long)sVar3 <= (long)pcVar4 - (long)__s1))) {
            if (*__s2 == '|') {
              sVar3 = (size_t)((int)sVar3 + 1);
            }
            else {
              iVar2 = bcmp(__s1,__s2,sVar3);
              if (iVar2 == 0) {
                memcpy(cc + 1,__s1,sVar3);
                cc[sVar3 + 1] = '\0';
                __s1 = __s1 + sVar3;
                goto LAB_00111b9c;
              }
            }
            __s2 = __s2 + sVar3;
          }
          pcVar4 = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",__s1);
          luaL_argerror(L,1,pcVar4);
LAB_00111b9c:
          sVar3 = strftime(local_460,0xfa,cc,(tm *)local_470);
          pcVar4 = local_468;
          b.n = b.n + sVar3;
        }
        else {
          if (b.size <= b.n) {
            luaL_prepbuffsize(&b,1);
            cVar1 = *__s1;
          }
          __s1 = __s1 + 1;
          b.b[b.n] = cVar1;
          b.n = b.n + 1;
        }
      }
      luaL_pushresult(&b);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int os_date (lua_State *L) {
  size_t slen;
  const char *s = luaL_optlstring(L, 1, "%c", &slen);
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  const char *se = s + slen;  /* 's' end */
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    return luaL_error(L,
                 "date result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (s < se) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s++;  /* skip '%' */
        s = checkoption(L, s, se - s, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}